

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

BSDFSample * __thiscall
pbrt::NormalizedFresnelBxDF::Sample_f
          (BSDFSample *__return_storage_ptr__,NormalizedFresnelBxDF *this,Vector3f *wo,Float uc,
          Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  SampledSpectrum SVar17;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  ulong uVar7;
  undefined1 auVar15 [56];
  
  if ((sampleFlags & Reflection) == Unset) {
    auVar10 = ZEXT1232(ZEXT412(0));
    *(undefined1 (*) [32])((__return_storage_ptr__->f).values.values + 3) = auVar10;
    __return_storage_ptr__->f = (SampledSpectrum)auVar10._0_16_;
    __return_storage_ptr__->wi = (Vector3f)auVar10._16_12_;
    __return_storage_ptr__->pdf = (Float)auVar10._28_4_;
    __return_storage_ptr__->eta = 1.0;
    return __return_storage_ptr__;
  }
  fVar8 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  fVar9 = (u->super_Tuple2<pbrt::Point2,_float>).y;
  auVar4._0_4_ = fVar8 + fVar8;
  auVar4._4_4_ = fVar9 + fVar9;
  auVar4._8_8_ = 0;
  auVar6._8_4_ = 0xbf800000;
  auVar6._0_8_ = 0xbf800000bf800000;
  auVar6._12_4_ = 0xbf800000;
  auVar4 = vaddps_avx512vl(auVar4,auVar6);
  fVar9 = auVar4._0_4_;
  auVar6 = vmovshdup_avx(auVar4);
  fVar8 = auVar6._0_4_;
  if (fVar9 == 0.0) {
    auVar13 = ZEXT816(0) << 0x40;
    if ((fVar8 == 0.0) && (!NAN(fVar8))) goto LAB_003ea95c;
  }
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(auVar4,auVar13);
  auVar16._0_4_ = fVar9 / fVar8;
  auVar16._4_12_ = auVar4._4_12_;
  auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar16,ZEXT416(0x3fc90fdb));
  auVar4 = vshufps_avx(auVar5,auVar5,0xf5);
  bVar3 = auVar4._0_4_ < auVar5._0_4_;
  local_48._4_12_ = auVar13._4_12_;
  local_48._0_4_ = (uint)bVar3 * (int)((fVar8 / fVar9) * 0.7853982) + (uint)!bVar3 * auVar13._0_4_;
  local_38._4_12_ = auVar6._4_12_;
  local_38._0_4_ = (uint)bVar3 * (int)fVar9 + (uint)!bVar3 * (int)fVar8;
  fVar8 = cosf((float)local_48._0_4_);
  fVar9 = sinf((float)local_48._0_4_);
  auVar13 = vinsertps_avx(ZEXT416((uint)((float)local_38._0_4_ * fVar8)),
                          ZEXT416((uint)((float)local_38._0_4_ * fVar9)),0x10);
LAB_003ea95c:
  auVar15 = ZEXT856(auVar13._8_8_);
  auVar6 = vmovshdup_avx(auVar13);
  local_58._0_8_ = vmovlps_avx(auVar13);
  auVar4 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
  auVar6 = vfnmadd213ss_fma(auVar6,auVar6,auVar4);
  auVar6 = vmaxss_avx(auVar6,ZEXT816(0) << 0x40);
  auVar6 = vsqrtss_avx(auVar6,auVar6);
  uVar7 = auVar6._8_8_;
  local_58.z = auVar6._0_4_;
  if ((wo->super_Tuple3<pbrt::Vector3,_float>).z < 0.0) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(auVar6,auVar5);
    uVar7 = auVar6._8_8_;
    local_58.z = auVar6._0_4_;
  }
  auVar12 = ZEXT856(uVar7);
  SVar17 = f(this,wo,(Vector3f *)&local_58,mode);
  auVar14._0_8_ = SVar17.values.values._8_8_;
  auVar14._8_56_ = auVar15;
  auVar11._0_8_ = SVar17.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(ZEXT416((uint)local_58.z),auVar2);
  uVar1 = vcmpss_avx512f(ZEXT416((uint)(local_58.z * (wo->super_Tuple3<pbrt::Vector3,_float>).z)),
                         ZEXT416(0),0xe);
  auVar6 = vmovlhps_avx(auVar11._0_16_,auVar14._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->f).values.values = auVar6;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x = local_58.x;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y = local_58.y;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = local_58.z;
  __return_storage_ptr__->pdf = (Float)((uint)((byte)uVar1 & 1) * (int)(auVar4._0_4_ * 0.31830987));
  __return_storage_ptr__->flags = DiffuseReflection;
  __return_storage_ptr__->eta = 1.0;
  __return_storage_ptr__->pdfIsProportional = false;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(const Vector3f &wo, Float uc, const Point2f &u,
                        TransportMode mode, BxDFReflTransFlags sampleFlags) const {
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return {};

        // Cosine-sample the hemisphere, flipping the direction if necessary
        Vector3f wi = SampleCosineHemisphere(u);
        if (wo.z < 0)
            wi.z *= -1;
        return BSDFSample(f(wo, wi, mode), wi, PDF(wo, wi, mode, sampleFlags),
                          BxDFFlags::DiffuseReflection);
    }